

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

wchar_t __thiscall Centaurus::Stream::get(Stream *this)

{
  bool bVar1;
  reference pwVar2;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_38;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_30;
  wchar_t local_24;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_20;
  wchar_t ch;
  Stream *local_18;
  Stream *this_local;
  
  local_18 = this;
  _Stack_20._M_current = (wchar_t *)std::__cxx11::wstring::end();
  bVar1 = __gnu_cxx::operator==(&this->m_cur,&stack0xffffffffffffffe0);
  if (bVar1) {
    this_local._4_4_ = L'\0';
  }
  else {
    local_30 = __gnu_cxx::
               __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               ::operator++(&this->m_cur,0);
    pwVar2 = __gnu_cxx::
             __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&local_30);
    local_24 = *pwVar2;
    if ((this->m_newline_flag & 1U) == 0) {
      this->m_pos = this->m_pos + 1;
    }
    else {
      this->m_newline_flag = false;
      this->m_line = this->m_line + 1;
      this->m_pos = 0;
    }
    if (local_24 == L'\r') {
      local_38._M_current = (wchar_t *)std::__cxx11::wstring::end();
      bVar1 = __gnu_cxx::operator==(&this->m_cur,&local_38);
      if (bVar1) {
        return L'\n';
      }
      pwVar2 = __gnu_cxx::
               __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               ::operator*(&this->m_cur);
      if (*pwVar2 == L'\n') {
        this->m_newline_flag = true;
        this->m_pos = this->m_pos + 1;
        __gnu_cxx::
        __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::operator++(&this->m_cur,0);
      }
    }
    else if ((((local_24 == L'\n') || (local_24 == L'\x85')) || (local_24 == L'\x2028')) ||
            (local_24 == L'\x2029')) {
      this->m_newline_flag = true;
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

wchar_t get()
    {
        if (m_cur == m_str.end())
            return 0;
        else
        {
            wchar_t ch = *(m_cur++);
            if (m_newline_flag)
            {
                m_newline_flag = false;
                m_line++;
                m_pos = 0;
            }
            else
            {
                m_pos++;
            }
            if (ch == L'\r')
            {
                if (m_cur == m_str.end())
                    return L'\n';
                if (*m_cur == L'\n')
                {
                    m_newline_flag = true;
                    m_pos++;
                    m_cur++;
                }
            }
            else if (ch == L'\n' || ch == L'\u0085' || ch == L'\u2028' || ch == L'\u2029')
            {
                m_newline_flag = true;
            }
            return ch;
        }
    }